

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::session_stats_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,session_stats_alert *this)

{
  char *__format;
  long lVar1;
  allocator<char> local_69;
  char msg [50];
  
  snprintf(msg,0x32,"session stats (%d values): ",299);
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,msg,&local_69)
  ;
  __format = "%ld";
  for (lVar1 = 0x10; lVar1 != 0x968; lVar1 = lVar1 + 8) {
    snprintf(msg,0x32,__format,*(undefined8 *)((long)(this->values)._M_elems + lVar1 + -0x10));
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    __format = ", %ld";
  }
  return __return_storage_ptr__;
}

Assistant:

std::string session_stats_alert::message() const
	{
		char msg[50];
		auto cnt = counters();
		std::snprintf(msg, sizeof(msg), "session stats (%d values): " , int(cnt.size()));
		std::string ret = msg;
		bool first = true;
		for (auto v : cnt)
		{
			std::snprintf(msg, sizeof(msg), first ? "%" PRId64 : ", %" PRId64, v);
			first = false;
			ret += msg;
		}
		return ret;
	}